

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_bool.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::equal_to(regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *that)

{
  regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prVar1;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar3;
  
  prVar1 = (this->rex_).
           super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::xpressive::detail::tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0L>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::detail::regex_domain,_0L>
           .proto_expr_.child0.impl_.px;
  if (prVar1 == (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    pmVar2 = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
  }
  else {
    pmVar2 = (prVar1->xpr_).px;
  }
  prVar1 = (that->rex_).
           super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::xpressive::detail::tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0L>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::xpressive::detail::regex_domain,_0L>
           .proto_expr_.child0.impl_.px;
  if (prVar1 == (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    pmVar3 = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
  }
  else {
    pmVar3 = (prVar1->xpr_).px;
  }
  if ((((pmVar2 == pmVar3) && ((this->state_).begin_._M_current == (that->state_).begin_._M_current)
       ) && ((this->state_).cur_._M_current == (that->state_).cur_._M_current)) &&
     ((this->state_).end_._M_current == (that->state_).end_._M_current)) {
    return this->flags_ == that->flags_;
  }
  return false;
}

Assistant:

explicit operator bool () const BOOST_SP_NOEXCEPT
    {
        return px != 0;
    }